

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

bool __thiscall
tinyusdz::GeomPrimvar::
get_value<std::vector<std::array<unsigned_int,3ul>,std::allocator<std::array<unsigned_int,3ul>>>>
          (GeomPrimvar *this,double timecode,
          vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
          *dest,TimeSampleInterpolationType interp,string *err)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  Attribute *this_00;
  bool bVar3;
  long *local_c0 [2];
  long local_b0 [2];
  double local_a0;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_> local_48;
  
  local_98._0_8_ = timecode;
  if (dest == (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
               *)0x0) {
joined_r0x0048ad84:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    args = err;
    local_a0 = timecode;
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar3 = false;
      }
      else {
        uVar2 = (*pvVar1->type_id)();
        bVar3 = uVar2 == 4;
      }
      if ((bVar3) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x0048ad84;
    }
    this_00 = &this->_attr;
    uVar2 = Attribute::type_id(this_00);
    bVar3 = IsSupportedGeomPrimvarType(uVar2);
    if (bVar3) {
      local_48.
      super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = Attribute::
              get<std::vector<std::array<unsigned_int,3ul>,std::allocator<std::array<unsigned_int,3ul>>>>
                        (this_00,local_a0,&local_48,interp);
      if (bVar3) {
        ::std::
        vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
        operator=(dest,&local_48);
      }
      else if (err != (string *)0x0) {
        local_c0[0] = local_b0;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c0,
                   "Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`"
                   ,"");
        local_98._12_4_ = 0x100026;
        Attribute::type_name_abi_cxx11_((string *)(local_98 + 0x10),this_00);
        fmt::format<double,unsigned_int,std::__cxx11::string>
                  ((string *)&local_68,(fmt *)local_c0,(string *)local_98,(double *)(local_98 + 0xc)
                   ,(uint *)(local_98 + 0x10),in_R9);
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._16_8_ != &local_78) {
          operator_delete((void *)local_98._16_8_,local_78._M_allocated_capacity + 1);
        }
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0],local_b0[0] + 1);
        }
      }
      if (local_48.
          super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return bVar3;
      }
      operator_delete(local_48.
                      super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return bVar3;
    }
    if (err != (string *)0x0) {
      local_c0[0] = local_b0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"Unsupported type for GeomPrimvar. type = `{}`","");
      Attribute::type_name_abi_cxx11_((string *)(local_98 + 0x10),this_00);
      fmt::format<std::__cxx11::string>
                (&local_68,(fmt *)local_c0,(string *)(local_98 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._16_8_ != &local_78) {
        operator_delete((void *)local_98._16_8_,local_78._M_allocated_capacity + 1);
      }
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0],local_b0[0] + 1);
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(double timecode, T *dest, value::TimeSampleInterpolationType interp, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
    if (err) {
      (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                            _attr.type_name());
    }
    return false;
  }

#if 0
  if (value::TimeCode(timecode).is_default()) {

    if (_attr.has_value()) {
      if (auto pv = _attr.get_value<T>()) {

        // copy
        (*dest) = pv.value();
        return true;

      } else {
        if (err) {
          (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
        }
        return false;
      }
    }

  }

  if (_attr.has_timesamples()) {
    T value;

    if (!_attr.get_value(timecode, &value, interp)) {
      if (err) {
        (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }

    // copy
    (*dest) = value;
    return true;
  }

  return false;
#else
  T value{};

  if (!_attr.get_value(timecode, &value, interp)) {
    if (err) {
      (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
    }
    return false;
  }

  // copy
  (*dest) = value;
  return true;
#endif

}